

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pfVar1;
  pointer pfVar2;
  uint uVar3;
  result_type rVar4;
  result_type rVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  pointer pfVar9;
  int iVar10;
  size_t i;
  long lVar11;
  bool bVar12;
  float local_2818;
  float local_2810;
  float local_280c;
  vector<int,_std::allocator<int>_> values_ps;
  vector<int,_std::allocator<int>_> ps;
  vector<int,_std::allocator<int>_> values_ref;
  vector<float,_std::allocator<float>_> ps_results;
  vector<float,_std::allocator<float>_> ref_results;
  vector<int,_std::allocator<int>_> ref;
  uniform_int_distribution<int> dist_rand;
  uniform_int_distribution<int> dist_value;
  random_device dev;
  mt19937 mt;
  
  ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::random_device::random_device(&dev);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar3);
  dist_value._M_param._M_a = 0;
  dist_value._M_param._M_b = 100000;
  dist_rand._M_param._M_a = 0;
  dist_rand._M_param._M_b = 10000000;
  for (lVar11 = 0; lVar11 != 10000000; lVar11 = lVar11 + 1) {
    values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,(int)lVar11);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ps,(int *)&values_ps);
  }
  lVar11 = 1000000;
  while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
    rVar4 = std::uniform_int_distribution<int>::operator()(&dist_value,&mt);
    rVar5 = std::uniform_int_distribution<int>::operator()(&dist_rand,&mt);
    ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[rVar5]
         = rVar4;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&ref,&ps);
  poVar6 = std::operator<<((ostream *)&std::cout,"Sorting ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,10000000);
  poVar6 = std::operator<<(poVar6," integers with a size of ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar10 = 10;
  while( true ) {
    pfVar2 = ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar1 = ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar12 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    if (bVar12) break;
    values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               &values_ps.super__Vector_base<int,_std::allocator<int>_>,&ps);
    std::vector<int,_std::allocator<int>_>::operator=(&values_ref,&ref);
    lVar11 = std::chrono::_V2::system_clock::now();
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    lVar7 = std::chrono::_V2::system_clock::now();
    PatienceSortFunc<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_2810 = (float)((lVar7 - lVar11) / 1000000);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&ref_results,&local_2810);
    local_2810 = (float)((lVar8 - lVar7) / 1000000);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&ps_results,&local_2810);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&values_ref.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&values_ps.super__Vector_base<int,_std::allocator<int>_>);
  }
  local_280c = 0.0;
  for (pfVar9 = ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar9 != ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar9 = pfVar9 + 1) {
    local_280c = local_280c + *pfVar9;
  }
  local_2818 = 0.0;
  for (pfVar9 = ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar9 != ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar9 = pfVar9 + 1) {
    local_2818 = local_2818 + *pfVar9;
  }
  lVar11 = (long)ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
  poVar6 = std::operator<<((ostream *)&std::cout,"std::sort:\t");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,local_280c / (float)(ulong)((long)pfVar2 - (long)pfVar1 >> 2));
  poVar6 = std::operator<<(poVar6," ms");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Patience Sort:\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2818 / (float)(ulong)(lVar11 >> 2));
  poVar6 = std::operator<<(poVar6," ms");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::random_device::~random_device(&dev);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&ps_results.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&ref_results.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ref.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ps.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {

    const int count = 10000000;
    const int max_value = 100000;
    const float randomness = 0.1f;          // Use 10% random values

    const int rounds = 10;                  // builds the average from 10 cycles
    vector<int> ps, ref;
    vector<float> ref_results, ps_results;
    float ref_result = 0;
    float ps_result = 0;
    int num_randoms;

    std::random_device dev;
    std::mt19937 mt(dev());
    std::uniform_int_distribution<int> dist_value(0, max_value);
    std::uniform_int_distribution<int> dist_rand(0, count);


    num_randoms = count * randomness;
    for(size_t i = 0; i < count; i++) {
        ps.push_back(i);
    }
    for(size_t i = 0; i < num_randoms; i++) {
        ps[dist_rand(mt)] = dist_value(mt);
    }
    ref = ps;

    cout << "Sorting " << count << " integers with a size of " << sizeof(int) << endl;

    for(int i = 0; i < rounds; i++) {
        vector<int> values_ps, values_ref;
        values_ps = ps;
        values_ref = ref;

        auto t0 = std::chrono::high_resolution_clock::now();
        sort(values_ref.begin(), values_ref.end());
        auto t1 = std::chrono::high_resolution_clock::now();
        PatienceSortFunc(values_ps.begin(), values_ps.end());
        auto t2 = std::chrono::high_resolution_clock::now();


        ref_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t1 - t0).count());
        ps_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count());

    }

    for_each(ref_results.begin(), ref_results.end(), [&](float f){ref_result += f;});
    for_each(ps_results.begin(), ps_results.end(), [&](float f){ps_result += f;});
    ref_result /= ref_results.size();
    ps_result /= ps_results.size();


    cout << "std::sort:\t" << ref_result << " ms" << endl;
    cout << "Patience Sort:\t" << ps_result << " ms" << endl;


    return 0;
}